

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

ValueHolder * __thiscall
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (internal *this,ThreadLocalValueHolderBase *base)

{
  ThreadLocalValueHolderBase *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *__s1;
  TestPartResultReporterInterface *pTVar3;
  TestPartResultReporterInterface *pTVar4;
  _func_int **pp_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  ValueHolder *pVVar8;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  TestPartResultReporterInterface *pTVar10;
  TestPartResultReporterInterface *pTVar11;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  TestPartResultReporterInterface *pTVar15;
  GTestLog local_14;
  
  if (this == (internal *)0x0) {
    __cxa_bad_typeid();
    pTVar15 = ((ValueHolder *)this)->value_;
    if (pTVar15 !=
        (TestPartResultReporterInterface *)
        (((ValueHolder *)((long)this + 0x10))->super_ThreadLocalValueHolderBase).
        _vptr_ThreadLocalValueHolderBase) {
      pTVar15->_vptr_TestPartResultReporterInterface = (_func_int **)(pTVar15 + 2);
      pVVar8 = (ValueHolder *)(base + 2);
      if ((ValueHolder *)base->_vptr_ThreadLocalValueHolderBase == pVVar8) {
        pp_Var5 = base[3]._vptr_ThreadLocalValueHolderBase;
        pTVar15[2]._vptr_TestPartResultReporterInterface =
             (pVVar8->super_ThreadLocalValueHolderBase)._vptr_ThreadLocalValueHolderBase;
        pTVar15[3]._vptr_TestPartResultReporterInterface = pp_Var5;
      }
      else {
        pTVar15->_vptr_TestPartResultReporterInterface = base->_vptr_ThreadLocalValueHolderBase;
        pTVar15[2]._vptr_TestPartResultReporterInterface =
             (pVVar8->super_ThreadLocalValueHolderBase)._vptr_ThreadLocalValueHolderBase;
      }
      pTVar15[1]._vptr_TestPartResultReporterInterface = base[1]._vptr_ThreadLocalValueHolderBase;
      base->_vptr_ThreadLocalValueHolderBase = (_func_int **)pVVar8;
      base[1]._vptr_ThreadLocalValueHolderBase = (_func_int **)0x0;
      *(undefined1 *)&base[2]._vptr_ThreadLocalValueHolderBase = 0;
      ((ValueHolder *)this)->value_ = ((ValueHolder *)this)->value_ + 4;
      return pVVar8;
    }
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_check_len((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this,1,"vector::_M_realloc_insert");
    pTVar3 = (TestPartResultReporterInterface *)
             (((ValueHolder *)this)->super_ThreadLocalValueHolderBase).
             _vptr_ThreadLocalValueHolderBase;
    pTVar4 = ((ValueHolder *)this)->value_;
    lVar12 = (long)pTVar15 - (long)pTVar3 >> 5;
    if (__n == 0) {
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      pbVar9 = __gnu_cxx::
               new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::allocate((new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this,__n,(void *)0x0);
    }
    pbVar14 = pbVar9 + lVar12;
    pbVar2 = pbVar9 + lVar12;
    (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
    pTVar1 = base + 2;
    if ((ThreadLocalValueHolderBase *)base->_vptr_ThreadLocalValueHolderBase == pTVar1) {
      pp_Var5 = base[3]._vptr_ThreadLocalValueHolderBase;
      (pbVar2->field_2)._M_allocated_capacity = (size_type)pTVar1->_vptr_ThreadLocalValueHolderBase;
      *(_func_int ***)((long)&pbVar2->field_2 + 8) = pp_Var5;
    }
    else {
      (pbVar14->_M_dataplus)._M_p = (pointer)base->_vptr_ThreadLocalValueHolderBase;
      (pbVar14->field_2)._M_allocated_capacity = (size_type)pTVar1->_vptr_ThreadLocalValueHolderBase
      ;
    }
    pbVar14->_M_string_length = (size_type)base[1]._vptr_ThreadLocalValueHolderBase;
    base->_vptr_ThreadLocalValueHolderBase = (_func_int **)pTVar1;
    base[1]._vptr_ThreadLocalValueHolderBase = (_func_int **)0x0;
    *(undefined1 *)&base[2]._vptr_ThreadLocalValueHolderBase = 0;
    pbVar14 = pbVar9;
    if (pTVar3 != pTVar15) {
      pTVar10 = pTVar3 + 2;
      paVar6 = &pbVar9->field_2;
      do {
        paVar13 = paVar6;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + -1))->
        _M_dataplus)._M_p = (pointer)paVar13;
        if (pTVar10 ==
            (TestPartResultReporterInterface *)pTVar10[-2]._vptr_TestPartResultReporterInterface) {
          pp_Var5 = pTVar10[1]._vptr_TestPartResultReporterInterface;
          paVar13->_M_allocated_capacity = (size_type)pTVar10->_vptr_TestPartResultReporterInterface
          ;
          *(_func_int ***)((long)paVar13 + 8) = pp_Var5;
        }
        else {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + -1))->
          _M_dataplus)._M_p = (pointer)pTVar10[-2]._vptr_TestPartResultReporterInterface;
          paVar13->_M_allocated_capacity = (size_type)pTVar10->_vptr_TestPartResultReporterInterface
          ;
        }
        *(_func_int ***)((long)paVar13 + -8) = pTVar10[-1]._vptr_TestPartResultReporterInterface;
        pTVar10[-2]._vptr_TestPartResultReporterInterface = (_func_int **)pTVar10;
        pTVar10[-1]._vptr_TestPartResultReporterInterface = (_func_int **)0x0;
        *(char *)&pTVar10->_vptr_TestPartResultReporterInterface = '\0';
        pTVar11 = pTVar10 + 2;
        pTVar10 = pTVar10 + 4;
        paVar6 = paVar13 + 2;
      } while (pTVar11 != pTVar15);
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + 1);
    }
    if (pTVar4 == pTVar15) {
      pbVar14 = pbVar14 + 1;
    }
    else {
      paVar6 = &pbVar14[1].field_2;
      pTVar15 = pTVar15 + 2;
      do {
        paVar13 = paVar6;
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + -1))->
        _M_dataplus)._M_p = (pointer)paVar13;
        if (pTVar15 ==
            (TestPartResultReporterInterface *)pTVar15[-2]._vptr_TestPartResultReporterInterface) {
          pp_Var5 = pTVar15[1]._vptr_TestPartResultReporterInterface;
          paVar13->_M_allocated_capacity = (size_type)pTVar15->_vptr_TestPartResultReporterInterface
          ;
          *(_func_int ***)((long)paVar13 + 8) = pp_Var5;
        }
        else {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + -1))->
          _M_dataplus)._M_p = (pointer)pTVar15[-2]._vptr_TestPartResultReporterInterface;
          paVar13->_M_allocated_capacity = (size_type)pTVar15->_vptr_TestPartResultReporterInterface
          ;
        }
        *(_func_int ***)((long)paVar13 + -8) = pTVar15[-1]._vptr_TestPartResultReporterInterface;
        pTVar15[-2]._vptr_TestPartResultReporterInterface = (_func_int **)pTVar15;
        pTVar15[-1]._vptr_TestPartResultReporterInterface = (_func_int **)0x0;
        *(char *)&pTVar15->_vptr_TestPartResultReporterInterface = '\0';
        pTVar10 = pTVar15 + 2;
        paVar6 = paVar13 + 2;
        pTVar15 = pTVar15 + 4;
      } while (pTVar10 != pTVar4);
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar13 + 1);
    }
    if (pTVar3 != (TestPartResultReporterInterface *)0x0) {
      operator_delete(pTVar3);
    }
    (((ValueHolder *)this)->super_ThreadLocalValueHolderBase)._vptr_ThreadLocalValueHolderBase =
         (_func_int **)pbVar9;
    ((ValueHolder *)this)->value_ = (TestPartResultReporterInterface *)pbVar14;
    (((ValueHolder *)((long)this + 0x10))->super_ThreadLocalValueHolderBase).
    _vptr_ThreadLocalValueHolderBase = (_func_int **)(pbVar9 + __n);
    return (ValueHolder *)this;
  }
  __s1 = *(char **)(*(long *)(*(long *)this + -8) + 8);
  if (__s1 != 
      "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE") {
    if (*__s1 != '*') {
      iVar7 = strcmp(__s1,
                     "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE"
                    );
      if (iVar7 == 0) goto LAB_00211544;
    }
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ee);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_14);
  }
LAB_00211544:
  pVVar8 = (ValueHolder *)
           __dynamic_cast(this,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                           typeinfo,0);
  return pVVar8;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}